

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prng.c
# Opt level: O1

void prngCOMBOStepR(void *buf,size_t count,void *state)

{
  long *plVar1;
  ulong count_00;
  int iVar2;
  long lVar3;
  int iVar4;
  
  plVar1 = (long *)((long)state + 0x10);
  count_00 = *(ulong *)((long)state + 0x10);
  if (count_00 != 0) {
    if (count <= count_00) {
      memCopy(buf,(void *)((long)plVar1 - count_00),count);
      lVar3 = *plVar1;
      goto LAB_00113900;
    }
    memCopy(buf,(void *)((long)plVar1 - count_00),count_00);
    count = count - *plVar1;
    buf = (void *)((long)buf + *plVar1);
    *plVar1 = 0;
  }
  if (3 < count) {
    do {
      iVar2 = *state * *state;
      *(undefined4 *)state = *(undefined4 *)((long)state + 4);
      *(int *)((long)state + 4) = iVar2;
      iVar4 = (*(uint *)((long)state + 8) >> 0x10) + (*(uint *)((long)state + 8) & 0xffff) * 0x78b7;
      *(int *)((long)state + 8) = iVar4;
      *(int *)((long)state + 0xc) = iVar4 + iVar2;
      memCopy(buf,(void *)((long)state + 0xc),4);
      buf = (void *)((long)buf + 4);
      count = count - 4;
    } while (3 < count);
  }
  if (count == 0) {
    return;
  }
  iVar2 = *state * *state;
  *(undefined4 *)state = *(undefined4 *)((long)state + 4);
  *(int *)((long)state + 4) = iVar2;
  iVar4 = (*(uint *)((long)state + 8) >> 0x10) + (*(uint *)((long)state + 8) & 0xffff) * 0x78b7;
  *(int *)((long)state + 8) = iVar4;
  *(int *)((long)state + 0xc) = iVar4 + iVar2;
  memCopy(buf,(void *)((long)state + 0xc),count);
  lVar3 = 4;
LAB_00113900:
  *plVar1 = lVar3 - count;
  return;
}

Assistant:

void prngCOMBOStepR(void* buf, size_t count, void* state)
{
	prng_combo_st* s = (prng_combo_st*)state;
	ASSERT(memIsValid(buf, count));
	ASSERT(memIsValid(s, sizeof(*s)));
	// есть резерв?
	if (s->reserved)
	{
		if (s->reserved >= count)
		{
			memCopy(buf, s->r.block + 4 - s->reserved, count);
			s->reserved -= count;
			return;
		}
		memCopy(buf, s->r.block + 4 - s->reserved, s->reserved);
		count -= s->reserved;
		buf = (octet*)buf + s->reserved;
		s->reserved = 0;
	}
	// цикл по полным блокам
	while (count >= 4)
	{
		prngCOMBOStep(s);
		memCopy(buf, s->r.block, 4);
		buf = (octet*)buf + 4;
		count -= 4;
	}
	// неполный блок?
	if (count)
	{
		prngCOMBOStep(s);
		memCopy(buf, s->r.block, count);
		s->reserved = 4 - count;
	}
}